

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_machine.hpp
# Opt level: O0

void __thiscall
estl::state_machine<cd_fsm_def>::state_conditions::~state_conditions(state_conditions *this)

{
  state_conditions *this_local;
  
  std::
  vector<estl::state_machine<cd_fsm_def>::condition,_std::allocator<estl::state_machine<cd_fsm_def>::condition>_>
  ::~vector(&this->conditions_m);
  return;
}

Assistant:

state_type operator()(const inputs_type& inputs)
        {
            // --- Logical OR of the conditions ---
            if (!conditions_m.empty()) {
                for (auto condition : conditions_m) {
                    if (condition(inputs)){
                        return condition.switch_to_state();
                    }
                }
            }
            return state_type::_END_;
        }